

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

vm_obj_id_t __thiscall
CVmObjClass::find_mod_src_obj(CVmObjClass *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  vm_obj_id_t self_00;
  int iVar1;
  vm_obj_id_t mod_obj_00;
  CVmObject *pCVar2;
  vm_obj_id_t in_EDX;
  vm_obj_id_t in_ESI;
  long *in_RDI;
  vm_obj_id_t sc;
  vm_obj_id_t my_mod_obj;
  vm_obj_id_t local_4;
  
  self_00 = get_mod_obj((CVmObjClass *)0x31081f);
  if (self_00 != 0) {
    if (in_EDX == self_00) {
      return in_ESI;
    }
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[7])(pCVar2,(ulong)in_EDX);
    if (iVar1 != 0) {
      return in_ESI;
    }
  }
  iVar1 = (**(code **)(*in_RDI + 0x40))(in_RDI,in_ESI);
  if ((iVar1 == 0) || (mod_obj_00 = (**(code **)(*in_RDI + 0x48))(in_RDI,in_ESI,0), mod_obj_00 == 0)
     ) {
    local_4 = 0;
  }
  else {
    vm_objp(0);
    local_4 = find_mod_src_obj((CVmObjClass *)CONCAT44(in_ESI,in_EDX),self_00,mod_obj_00);
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmObjClass::find_mod_src_obj(VMG_ vm_obj_id_t self,
                                          vm_obj_id_t mod_obj)
{
    vm_obj_id_t my_mod_obj;
    vm_obj_id_t sc;
    
    /* 
     *   Is this one of my modifier objects?  It is if it's my most
     *   specialized modifier object (i.e., get_mod_obj()), or if my most
     *   specialized modifier object descends from the given object. 
     */
    my_mod_obj = get_mod_obj();
    if (my_mod_obj != VM_INVALID_OBJ
        && (mod_obj == my_mod_obj
            || vm_objp(vmg_ my_mod_obj)->is_instance_of(vmg_ mod_obj)))
    {
        /* it's one of mine, so I'm the intrinsic class mod_obj modifies */
        return self;
    }

    /* 
     *   It's not one of mine, so check my superclasses recursively.  If we
     *   have no direct superclass, we've failed to find the object.  
     */
    if (get_superclass_count(vmg_ self) == 0
        || (sc = get_superclass(vmg_ self, 0)) == VM_INVALID_OBJ)
        return VM_INVALID_OBJ;
    
    /* ask the superclass to find the modifier */
    return ((CVmObjClass *)vm_objp(vmg_ sc))
        ->find_mod_src_obj(vmg_ sc, mod_obj);
}